

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceVertexIsolatedScalarQuantity::SurfaceVertexIsolatedScalarQuantity
          (SurfaceVertexIsolatedScalarQuantity *this,string *name,
          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
          *values_,SurfaceMesh *mesh_)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  iterator this_00;
  reference ppVar5;
  mapped_type_conflict1 *pmVar6;
  string *in_RSI;
  undefined8 *in_RDI;
  pair<unsigned_long,_double> *t_1;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *__range1;
  size_t iP;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  newValues;
  pair<unsigned_long,_double> *t;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *__range2;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  m;
  value_type *in_stack_fffffffffffffe58;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe60;
  unsigned_long *in_stack_fffffffffffffe68;
  double dVar7;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *in_stack_fffffffffffffe70;
  key_type_conflict *in_stack_fffffffffffffe98;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *in_stack_fffffffffffffea0;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  in_stack_fffffffffffffef8;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *in_stack_ffffffffffffff00;
  _Self local_f8;
  _Self local_f0;
  ulong local_e8;
  reference local_c8;
  pair<unsigned_long,_double> *local_c0;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  local_b8 [10];
  string *in_stack_ffffffffffffff98;
  SurfaceMesh *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  SurfaceCountQuantity *in_stack_ffffffffffffffb0;
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"isolated vertex scalar",
             (allocator *)&stack0xffffffffffffff9f);
  SurfaceCountQuantity::SurfaceCountQuantity
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string(local_40);
  *in_RDI = &PTR__SurfaceVertexIsolatedScalarQuantity_00795e00;
  std::
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::map((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
         *)0x3c851c);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI[1] + 0x228));
  if (sVar3 != 0) {
    std::
    map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::map((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           *)0x3c8548);
    local_b8[0]._M_current =
         (pair<unsigned_long,_double> *)
         std::
         vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
         ::begin((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  *)in_stack_fffffffffffffe58);
    local_c0 = (pair<unsigned_long,_double> *)
               std::
               vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               ::end((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      *)in_stack_fffffffffffffe58);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                               *)in_stack_fffffffffffffe60,
                              (__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                               *)in_stack_fffffffffffffe58), bVar2) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                 ::operator*(local_b8);
      in_stack_fffffffffffffe98 = (key_type_conflict *)local_c8->second;
      in_stack_fffffffffffffea0 =
           (map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            *)std::
              map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
              ::operator[](in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      *(key_type_conflict **)&(in_stack_fffffffffffffea0->_M_t)._M_impl = in_stack_fffffffffffffe98;
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
      ::operator++(local_b8);
    }
    std::
    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
    vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            *)0x3c8673);
    for (local_e8 = 0; uVar1 = local_e8, sVar4 = SurfaceMesh::nVertices((SurfaceMesh *)0x3c869a),
        uVar1 < sVar4; local_e8 = local_e8 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI[1] + 0x228),
                 local_e8);
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ::find((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                   *)in_stack_fffffffffffffe58,(key_type_conflict *)0x3c86e1);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ::end((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                  *)in_stack_fffffffffffffe58);
      bVar2 = std::operator!=(&local_f0,&local_f8);
      if (bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI[1] + 0x228),
                   local_e8);
        std::
        map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
        ::operator[](in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
        ::emplace_back<unsigned_long&,double&>
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                   (double *)in_stack_fffffffffffffe60);
      }
    }
    std::
    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
    operator=(in_stack_ffffffffffffff00,
              (vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               *)in_stack_fffffffffffffef8._M_current);
    std::
    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
    ~vector(in_stack_fffffffffffffe70);
    std::
    map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::~map((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            *)0x3c87e3);
  }
  std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::begin((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           *)in_stack_fffffffffffffe58);
  this_00 = std::
            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            ::end((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   *)in_stack_fffffffffffffe58);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                             *)in_stack_fffffffffffffe60,
                            (__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                             *)in_stack_fffffffffffffe58), bVar2) {
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
             ::operator*((__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                          *)&stack0xfffffffffffffef8);
    dVar7 = ppVar5->second;
    pmVar6 = std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::operator[](in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    *pmVar6 = dVar7;
    in_stack_fffffffffffffe60 = (vec<3,_float,_(glm::qualifier)0> *)(in_RDI + 0x10);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  *)(in_RDI[1] + 0x2c8),ppVar5->first);
    std::make_pair<glm::vec<3,float,(glm::qualifier)0>&,double&>
              (in_stack_fffffffffffffe60,(double *)in_stack_fffffffffffffe58);
    std::
    vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
    ::push_back((vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
                 *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
    ::operator++((__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                  *)&stack0xfffffffffffffef8);
  }
  SurfaceCountQuantity::initializeLimits((SurfaceCountQuantity *)this_00._M_current);
  return;
}

Assistant:

SurfaceVertexIsolatedScalarQuantity::SurfaceVertexIsolatedScalarQuantity(std::string name,
                                                                         std::vector<std::pair<size_t, double>> values_,
                                                                         SurfaceMesh& mesh_)
    : SurfaceCountQuantity(name, mesh_, "isolated vertex scalar")

{

  // Apply permutation if needed
  if (parent.vertexPerm.size() > 0) {

    // Build a temporary map to invert
    std::map<size_t, double> m;
    for (auto& t : values_) {
      m[t.first] = t.second;
    }

    // Invert
    std::vector<std::pair<size_t, double>> newValues;
    for (size_t iP = 0; iP < parent.nVertices(); iP++) {
      if (m.find(parent.vertexPerm[iP]) != m.end()) {
        newValues.emplace_back(iP, m[parent.vertexPerm[iP]]);
      }
    }

    values_ = newValues;
  }

  for (auto& t : values_) {
    values[t.first] = t.second;
    entries.push_back(std::make_pair(parent.vertices[t.first], t.second));
  }

  initializeLimits();
}